

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

ON_XMLNode * __thiscall ON_PostEffect::CImpl::PepNode(CImpl *this)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  ON_XMLNode *pep_section_node;
  undefined4 extraout_var;
  
  if (this->_collection == (ON_PostEffects *)0x0) {
    pOVar2 = this->_local_node;
    if (pOVar2 == (ON_XMLNode *)0x0) {
      pOVar2 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar2,L"plug-in");
      this->_local_node = pOVar2;
    }
  }
  else {
    pOVar2 = ON_PostEffects::WritablePostEffectsNode(this->_collection);
    pep_section_node = GetPostEffectTypeNode(pOVar2,this->_type);
    if (pep_section_node == (ON_XMLNode *)0x0) {
      pOVar2 = (ON_XMLNode *)0x0;
    }
    else {
      pOVar2 = FindPostEffectNodeForId(pep_section_node,&this->_id);
      if (pOVar2 == (ON_XMLNode *)0x0) {
        pOVar2 = (ON_XMLNode *)operator_new(0xe8);
        ON_XMLNode::ON_XMLNode(pOVar2,L"plug-in");
        iVar1 = (*pep_section_node->_vptr_ON_XMLNode[0xb])(pep_section_node,pOVar2);
        return (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
      }
    }
  }
  return pOVar2;
}

Assistant:

ON_XMLNode* ON_PostEffect::CImpl::PepNode(void) const
{
  if (nullptr != _collection)
  {
    ON_XMLNode& post_effects_node = _collection->WritablePostEffectsNode();
    ON_XMLNode* pep_type_node = GetPostEffectTypeNode(post_effects_node, _type);
    if (nullptr == pep_type_node)
      return nullptr;

    ON_XMLNode* pep_node = FindPostEffectNodeForId(*pep_type_node, _id);
    if (nullptr == pep_node)
    {
      pep_node = pep_type_node->AttachChildNode(new ON_XMLNode(ON_RDK_PEP_PLUG_IN));
    }

    return pep_node;
  }

  // This post effect is not a member of a collection; it's free-floating so we need to use
  // a local node to hold its state.
  if (nullptr == _local_node)
    _local_node = new ON_XMLNode(ON_RDK_PEP_PLUG_IN);

  return _local_node;
}